

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

Am_Value step_1D(Am_Value *curr_value,Am_Value *step_size,Am_Value *value2,bool *keep_running)

{
  bool bVar1;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar2;
  undefined1 *in_R8;
  float fVar3;
  float fVar4;
  float fVar5;
  Am_Value AVar6;
  float v2;
  float step;
  float v;
  bool *keep_running_local;
  Am_Value *value2_local;
  Am_Value *step_size_local;
  Am_Value *curr_value_local;
  
  fVar3 = Am_Value::operator_cast_to_float(step_size);
  fVar4 = Am_Value::operator_cast_to_float(value2);
  bVar1 = Am_Value::Exists((Am_Value *)keep_running);
  if (bVar1) {
    fVar5 = Am_Value::operator_cast_to_float((Am_Value *)keep_running);
    if (fVar5 <= fVar3) {
      v2 = fVar3;
      if ((fVar5 < fVar3) && (v2 = fVar5, fVar5 <= fVar3 - fVar4)) {
        *in_R8 = 1;
        v2 = fVar3 - fVar4;
      }
    }
    else {
      v2 = fVar5;
      if (fVar4 + fVar3 <= fVar5) {
        *in_R8 = 1;
        v2 = fVar4 + fVar3;
      }
    }
  }
  else {
    *in_R8 = 1;
    v2 = fVar4 + fVar3;
  }
  if ((step_size->type == 2) || (step_size->type == 3)) {
    Am_Value::Am_Value(curr_value,(int)v2);
    aVar2 = extraout_RDX;
  }
  else {
    Am_Value::Am_Value(curr_value,v2);
    aVar2 = extraout_RDX_00;
  }
  AVar6.value.wrapper_value = aVar2.wrapper_value;
  AVar6._0_8_ = curr_value;
  return AVar6;
}

Assistant:

static Am_Value
step_1D(const Am_Value &curr_value, const Am_Value &step_size,
        const Am_Value &value2, bool &keep_running)
{
  float v = curr_value;
  float step = step_size;

  if (value2.Exists()) {
    float v2 = value2;

    if (v < v2) {
      v += step;
      if (v > v2)
        v = v2;
      else
        keep_running = true;
    } else if (v > v2) {
      v -= step;
      if (v < v2)
        v = v2;
      else
        keep_running = true;
    }
  } else {
    v += step;
    keep_running = true;
  }

  if (curr_value.type == Am_INT || curr_value.type == Am_LONG)
    return (int)v;
  else
    return v;
}